

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O3

void y4m_convert_444_420jpeg(y4m_input *_y4m,uchar *_dst,uchar *_aux)

{
  ulong uVar1;
  int iVar2;
  int _c_h;
  int iVar3;
  uchar uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uchar *puVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  int _c_w;
  uint uVar12;
  int iVar13;
  int iVar14;
  uchar *_dst_00;
  long lVar15;
  uchar *_src;
  uint uVar16;
  
  iVar2 = _y4m->pic_w;
  _c_h = _y4m->pic_h;
  _dst_00 = _dst + _c_h * iVar2;
  iVar14 = (iVar2 + _y4m->src_c_dec_h + -1) / _y4m->src_c_dec_h;
  _c_w = (iVar2 + _y4m->dst_c_dec_h + -1) / _y4m->dst_c_dec_h;
  iVar2 = _y4m->dst_c_dec_v;
  _src = _aux + _c_h * iVar14 * 2;
  lVar15 = (long)iVar14;
  uVar16 = (uint)(lVar15 + -1);
  iVar13 = 1;
  uVar5 = 1;
  if ((int)uVar16 < 1) {
    uVar5 = uVar16;
  }
  uVar9 = 2;
  if ((int)uVar16 < 2) {
    uVar9 = uVar16;
  }
  uVar6 = 3;
  if ((int)uVar16 < 3) {
    uVar6 = uVar16;
  }
  do {
    if (0 < _c_h) {
      iVar3 = 0;
      do {
        uVar10 = 0;
        if (0 < iVar14) {
          iVar7 = (int)((uint)_aux[(int)uVar6] + (uint)_aux[(int)uVar6] * 2 +
                        (uint)_aux[(int)uVar5] * 0x4e + (uint)*_aux * 0x40 +
                        (uint)_aux[(int)uVar9] * -0x11 + 0x40) >> 7;
          if (0xfe < iVar7) {
            iVar7 = 0xff;
          }
          uVar4 = (uchar)iVar7;
          if (iVar7 < 1) {
            uVar4 = '\0';
          }
          *_src = uVar4;
          uVar10 = 2;
        }
        if ((int)uVar10 < iVar14 + -3) {
          uVar11 = (ulong)uVar10;
          puVar8 = _src + (uVar10 >> 1);
          do {
            iVar7 = (int)(((uint)_aux[uVar11 + 3] + (uint)_aux[uVar11 - 2]) * 3 +
                          ((uint)_aux[uVar11 + 2] + (uint)_aux[uVar11 - 1]) * -0x11 +
                          ((uint)_aux[uVar11 + 1] + (uint)_aux[uVar11]) * 0x4e + 0x40) >> 7;
            if (0xfe < iVar7) {
              iVar7 = 0xff;
            }
            if (iVar7 < 1) {
              iVar7 = 0;
            }
            uVar11 = uVar11 + 2;
            *puVar8 = (uchar)iVar7;
            puVar8 = puVar8 + 1;
          } while ((long)uVar11 < (long)(iVar14 + -3));
          uVar10 = (uint)uVar11;
        }
        if ((int)uVar10 < iVar14) {
          puVar8 = _src + (uVar10 >> 1);
          uVar11 = (ulong)uVar10;
          do {
            uVar1 = uVar11 + 2;
            uVar10 = uVar16;
            if ((int)(uint)uVar1 < (int)uVar16) {
              uVar10 = (uint)uVar1;
            }
            uVar12 = (uint)uVar11 | 1;
            if ((int)uVar16 <= (int)uVar12) {
              uVar12 = uVar16;
            }
            iVar7 = (int)(((uint)_aux[lVar15 + -1] + (uint)_aux[uVar11 - 2]) * 3 +
                          ((uint)_aux[(int)uVar10] + (uint)_aux[uVar11 - 1]) * -0x11 +
                          ((uint)_aux[(int)uVar12] + (uint)_aux[uVar11]) * 0x4e + 0x40) >> 7;
            if (0xfe < iVar7) {
              iVar7 = 0xff;
            }
            if (iVar7 < 1) {
              iVar7 = 0;
            }
            *puVar8 = (uchar)iVar7;
            puVar8 = puVar8 + 1;
            uVar11 = uVar1;
          } while ((long)uVar1 < lVar15);
        }
        _src = _src + _c_w;
        _aux = _aux + lVar15;
        iVar3 = iVar3 + 1;
      } while (iVar3 != _c_h);
    }
    _src = _src + -(long)(_c_w * _c_h);
    y4m_422jpeg_420jpeg_helper(_dst_00,_src,_c_w,_c_h);
    _dst_00 = _dst_00 + ((_c_h + iVar2 + -1) / iVar2) * _c_w;
    iVar13 = iVar13 + 1;
  } while (iVar13 != 3);
  return;
}

Assistant:

static void y4m_convert_444_420jpeg(y4m_input *_y4m, unsigned char *_dst,
                                    unsigned char *_aux) {
  unsigned char *tmp;
  int c_w;
  int c_h;
  int c_sz;
  int dst_c_w;
  int dst_c_h;
  int dst_c_sz;
  int tmp_sz;
  int pli;
  int y;
  int x;
  /*Skip past the luma data.*/
  _dst += _y4m->pic_w * _y4m->pic_h;
  /*Compute the size of each chroma plane.*/
  c_w = (_y4m->pic_w + _y4m->src_c_dec_h - 1) / _y4m->src_c_dec_h;
  c_h = _y4m->pic_h;
  dst_c_w = (_y4m->pic_w + _y4m->dst_c_dec_h - 1) / _y4m->dst_c_dec_h;
  dst_c_h = (_y4m->pic_h + _y4m->dst_c_dec_v - 1) / _y4m->dst_c_dec_v;
  c_sz = c_w * c_h;
  dst_c_sz = dst_c_w * dst_c_h;
  tmp_sz = dst_c_w * c_h;
  tmp = _aux + 2 * c_sz;
  for (pli = 1; pli < 3; pli++) {
    /*Filter: [3 -17 78 78 -17 3]/128, derived from a 6-tap Lanczos window.*/
    for (y = 0; y < c_h; y++) {
      for (x = 0; x < OC_MINI(c_w, 2); x += 2) {
        tmp[x >> 1] = OC_CLAMPI(0,
                                (64 * _aux[0] + 78 * _aux[OC_MINI(1, c_w - 1)] -
                                 17 * _aux[OC_MINI(2, c_w - 1)] +
                                 3 * _aux[OC_MINI(3, c_w - 1)] + 64) >>
                                    7,
                                255);
      }
      for (; x < c_w - 3; x += 2) {
        tmp[x >> 1] = OC_CLAMPI(0,
                                (3 * (_aux[x - 2] + _aux[x + 3]) -
                                 17 * (_aux[x - 1] + _aux[x + 2]) +
                                 78 * (_aux[x] + _aux[x + 1]) + 64) >>
                                    7,
                                255);
      }
      for (; x < c_w; x += 2) {
        tmp[x >> 1] =
            OC_CLAMPI(0,
                      (3 * (_aux[x - 2] + _aux[c_w - 1]) -
                       17 * (_aux[x - 1] + _aux[OC_MINI(x + 2, c_w - 1)]) +
                       78 * (_aux[x] + _aux[OC_MINI(x + 1, c_w - 1)]) + 64) >>
                          7,
                      255);
      }
      tmp += dst_c_w;
      _aux += c_w;
    }
    tmp -= tmp_sz;
    /*Now do the vertical filtering.*/
    y4m_422jpeg_420jpeg_helper(_dst, tmp, dst_c_w, c_h);
    _dst += dst_c_sz;
  }
}